

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather_test.c
# Opt level: O3

REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,char *filename,REF_INT version)

{
  REF_GEOM ref_geom;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_GRID_conflict ref_grid;
  REF_INT cell;
  REF_INT nodes [27];
  REF_GRID local_c0;
  REF_DBL local_b8 [3];
  REF_INT local_9c;
  REF_INT local_98 [30];
  
  if (ref_mpi->id == 0) {
    uVar1 = ref_fixture_tet_brick_grid(&local_c0,ref_mpi);
    if (uVar1 == 0) {
      local_c0->meshb_version = version;
      ref_geom = local_c0->geom;
      local_98[0] = 0;
      local_98[1] = 1;
      local_98[2] = 0xf;
      uVar1 = ref_cell_add(local_c0->cell[0],local_98,&local_9c);
      if (uVar1 == 0) {
        uVar1 = ref_geom_add(ref_geom,0,0,1,local_b8);
        if (uVar1 == 0) {
          uVar1 = ref_geom_add(ref_geom,1,0,2,local_b8);
          if (uVar1 == 0) {
            local_b8[0] = 10.0;
            uVar1 = ref_geom_add(ref_geom,0,1,0xf,local_b8);
            if (uVar1 == 0) {
              local_b8[0] = 20.0;
              uVar1 = ref_geom_add(ref_geom,1,1,0xf,local_b8);
              if (uVar1 == 0) {
                local_b8[0] = 10.0;
                local_b8[1] = 20.0;
                uVar1 = ref_geom_add(ref_geom,0,2,3,local_b8);
                if (uVar1 == 0) {
                  local_b8[0] = 11.0;
                  local_b8[1] = 20.0;
                  uVar1 = ref_geom_add(ref_geom,1,2,3,local_b8);
                  if (uVar1 == 0) {
                    local_b8[0] = 10.5;
                    local_b8[1] = 21.0;
                    uVar1 = ref_geom_add(ref_geom,2,2,3,local_b8);
                    if (uVar1 == 0) {
                      uVar1 = ref_export_by_extension(local_c0,filename);
                      if (uVar1 == 0) {
                        uVar1 = ref_grid_free(local_c0);
                        if (uVar1 == 0) goto LAB_00111298;
                        pcVar3 = "free";
                        uVar2 = 0x62;
                      }
                      else {
                        pcVar3 = "export";
                        uVar2 = 0x61;
                      }
                    }
                    else {
                      pcVar3 = "add geom face";
                      uVar2 = 0x5f;
                    }
                  }
                  else {
                    pcVar3 = "add geom face";
                    uVar2 = 0x59;
                  }
                }
                else {
                  pcVar3 = "add geom face";
                  uVar2 = 0x53;
                }
              }
              else {
                pcVar3 = "add geom edge";
                uVar2 = 0x4d;
              }
            }
            else {
              pcVar3 = "add geom edge";
              uVar2 = 0x49;
            }
          }
          else {
            pcVar3 = "add geom node";
            uVar2 = 0x44;
          }
        }
        else {
          pcVar3 = "add geom node";
          uVar2 = 0x41;
        }
      }
      else {
        pcVar3 = "add edge";
        uVar2 = 0x3d;
      }
    }
    else {
      pcVar3 = "set up tet";
      uVar2 = 0x37;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c",
           uVar2,"ref_gather_meshb_fixture",(ulong)uVar1,pcVar3);
  }
  else {
LAB_00111298:
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,
                                                   const char *filename,
                                                   REF_INT version) {
  REF_GRID ref_grid;
  REF_GEOM ref_geom;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_DBL param[2];

  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_fixture_tet_brick_grid(&ref_grid, ref_mpi), "set up tet");
    ref_grid_meshb_version(ref_grid) = version;
    ref_geom = ref_grid_geom(ref_grid);
    nodes[0] = 0;
    nodes[1] = 1;
    nodes[2] = 15;
    RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &cell), "add edge");
    type = REF_GEOM_NODE;
    id = 1;
    node = 0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    id = 2;
    node = 1;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    type = REF_GEOM_EDGE;
    id = 15;
    node = 0;
    param[0] = 10.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    id = 15;
    node = 1;
    param[0] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    type = REF_GEOM_FACE;
    id = 3;
    node = 0;
    param[0] = 10.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 1;
    param[0] = 11.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 2;
    param[0] = 10.5;
    param[1] = 21.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");

    RSS(ref_export_by_extension(ref_grid, filename), "export");
    RSS(ref_grid_free(ref_grid), "free");
  }
  return REF_SUCCESS;
}